

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  size_t body_size_1;
  size_t body_size_3;
  size_t body_size_4;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  uint8_t *local_a8;
  size_t body_start_4;
  size_t capacity_4;
  uint8_t *puStack_90;
  uint16_t _v;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t i;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t sStack_30;
  int ret;
  size_t num_certificates_local;
  ptls_iovec_t *certificates_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t context_local;
  
  context_local.base = (uint8_t *)context.len;
  buf_local = (ptls_buffer_t *)context.base;
  body_start = 1;
  sStack_30 = num_certificates;
  num_certificates_local = (size_t)certificates;
  certificates_local = (ptls_iovec_t *)buf;
  capacity._4_4_ = ptls_buffer__do_pushv(buf,"",1);
  if (capacity._4_4_ == 0) {
    body_size = (size_t)certificates_local[1].base;
    capacity._4_4_ =
         ptls_buffer__do_pushv
                   ((ptls_buffer_t *)certificates_local,buf_local,(size_t)context_local.base);
    if (capacity._4_4_ == 0) {
      capacity_1 = (long)certificates_local[1].base - body_size;
      if (body_start == 0xffffffffffffffff) {
        iVar3 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)certificates_local,capacity_1);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      else {
        for (; body_start != 0; body_start = body_start - 1) {
          certificates_local->base[body_size - body_start] =
               (uint8_t)(capacity_1 >> (((char)body_start + -1) * '\b' & 0x3fU));
        }
      }
      capacity._4_4_ = 0;
      body_start_1 = 3;
      capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)certificates_local,"",3);
      if (capacity._4_4_ == 0) {
        i = (size_t)certificates_local[1].base;
        for (capacity_2 = 0; capacity._4_4_ = 0, capacity_2 != sStack_30;
            capacity_2 = capacity_2 + 1) {
          body_start_2 = 3;
          capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)certificates_local,"",3);
          if (capacity._4_4_ != 0) {
            return capacity._4_4_;
          }
          body_size_2 = (size_t)certificates_local[1].base;
          capacity._4_4_ =
               ptls_buffer__do_pushv
                         ((ptls_buffer_t *)certificates_local,
                          *(void **)(num_certificates_local + capacity_2 * 0x10),
                          *(size_t *)(num_certificates_local + capacity_2 * 0x10 + 8));
          if (capacity._4_4_ != 0) {
            return capacity._4_4_;
          }
          capacity_3 = (long)certificates_local[1].base - body_size_2;
          if (body_start_2 == 0xffffffffffffffff) {
            iVar3 = ptls_buffer__adjust_quic_blocksize
                              ((ptls_buffer_t *)certificates_local,capacity_3);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          else {
            for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
              certificates_local->base[body_size_2 - body_start_2] =
                   (uint8_t)(capacity_3 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
            }
          }
          capacity._4_4_ = 0;
          body_start_3 = 2;
          capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)certificates_local,"",2);
          if (capacity._4_4_ != 0) {
            return capacity._4_4_;
          }
          puStack_90 = certificates_local[1].base;
          if ((capacity_2 == 0) && (ocsp_status.len != 0)) {
            capacity_4._6_2_ = 5;
            capacity_4._4_1_ = 0;
            capacity_4._5_1_ = 5;
            capacity._4_4_ =
                 ptls_buffer__do_pushv
                           ((ptls_buffer_t *)certificates_local,(void *)((long)&capacity_4 + 4),2);
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            body_start_4 = 2;
            capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)certificates_local,"",2);
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            local_a8 = certificates_local[1].base;
            capacity_5._7_1_ = 1;
            capacity._4_4_ =
                 ptls_buffer__do_pushv
                           ((ptls_buffer_t *)certificates_local,(void *)((long)&capacity_5 + 7),1);
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            body_start_5 = 3;
            capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)certificates_local,"",3);
            if (capacity._4_4_ != 0) {
              return capacity._4_4_;
            }
            puVar1 = certificates_local[1].base;
            iVar3 = ptls_buffer__do_pushv
                              ((ptls_buffer_t *)certificates_local,ocsp_status.base,ocsp_status.len)
            ;
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar2 = certificates_local[1].base;
            for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
              certificates_local->base[(long)puVar1 - body_start_5] =
                   (uint8_t)((ulong)((long)puVar2 - (long)puVar1) >>
                            (((char)body_start_5 + -1) * '\b' & 0x3fU));
            }
            capacity._4_4_ = 0;
            uVar4 = (long)certificates_local[1].base - (long)local_a8;
            if (body_start_4 == 0xffffffffffffffff) {
              iVar3 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)certificates_local,uVar4);
              if (iVar3 != 0) {
                return iVar3;
              }
            }
            else {
              for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                certificates_local->base[(long)local_a8 - body_start_4] =
                     (uint8_t)(uVar4 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
              }
            }
          }
          capacity._4_4_ = 0;
          uVar4 = (long)certificates_local[1].base - (long)puStack_90;
          if (body_start_3 == 0xffffffffffffffff) {
            iVar3 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)certificates_local,uVar4);
            if (iVar3 != 0) {
              return iVar3;
            }
          }
          else {
            for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
              certificates_local->base[(long)puStack_90 - body_start_3] =
                   (uint8_t)(uVar4 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
            }
          }
        }
        uVar4 = (long)certificates_local[1].base - i;
        if (body_start_1 == 0xffffffffffffffff) {
          iVar3 = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)certificates_local,uVar4);
          if (iVar3 != 0) {
            return iVar3;
          }
        }
        else {
          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
            certificates_local->base[i - body_start_1] =
                 (uint8_t)(uVar4 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
          }
        }
        capacity._4_4_ = 0;
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}